

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O2

int read_block(string *drive,uint64_t lba,int block_size,char *buf)

{
  int iVar1;
  ifstream fin;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&fin);
  std::ifstream::open((char *)&fin,(_Ios_Openmode)(drive->_M_dataplus)._M_p);
  if ((abStack_210[*(long *)(_fin + -0x18)] & 5) == 0) {
    std::istream::seekg(&fin,lba * (long)block_size,0);
    std::istream::read((char *)&fin,(long)buf);
    iVar1 = 0;
    std::ifstream::close();
  }
  else {
    iVar1 = -1;
  }
  std::ifstream::~ifstream(&fin);
  return iVar1;
}

Assistant:

int read_block(string drive, uint64_t lba, int block_size, char *buf)
{
	ifstream fin;

	fin.open(drive.c_str(), ios_base::binary);
	if (!fin)
		return -1;
	fin.seekg(lba*block_size);
	fin.read(buf, block_size);
	fin.close();
	return 0;
}